

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O3

void __thiscall Psbt_SetTxOutOnly_Test::TestBody(Psbt_SetTxOutOnly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  Psbt psbt2;
  Amount amount;
  HDWallet wallet2;
  HDWallet wallet1;
  string path2;
  string path1;
  Psbt psbt;
  Address addr1;
  Address addr2;
  TxOutReference txout_2r;
  TxOut txout_2;
  TxOut txout_1;
  KeyData key1;
  KeyData key2;
  AssertHelper local_860;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_858;
  ByteData local_850;
  AssertHelper local_830;
  undefined1 local_828 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_820;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_818 [64];
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  local_7d8 [48];
  Amount local_7a8 [16];
  void *local_798 [3];
  void *local_780 [3];
  undefined1 *local_768 [2];
  undefined1 local_758 [16];
  undefined1 *local_748 [2];
  undefined1 local_738 [16];
  Psbt local_728;
  ByteData local_6a8;
  uchar local_688 [16];
  void *local_678;
  void *local_660;
  void *local_648;
  code *local_630 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_5b8;
  Script local_5a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_560;
  Pubkey local_530;
  uchar local_510 [16];
  void *local_500;
  void *local_4e8;
  void *local_4d0;
  code *local_4b8 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_440;
  Script local_428;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  undefined **local_3b8 [3];
  Script local_3a0;
  code *local_368 [3];
  Script local_350;
  code *local_318 [3];
  Script local_300;
  KeyData local_2c8;
  KeyData local_178;
  
  cfd::Psbt::Psbt(&local_728);
  local_530.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_2c8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = cfd::core::Psbt::GetTxOutCount();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_6a8,"0","psbt.GetTxOutCount()",(int *)&local_530,(uint *)&local_2c8)
  ;
  if (local_6a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_530);
    if (local_6a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_6a8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x37b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if (CONCAT44(local_530.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 local_530.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_530.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_530.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_530.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_530.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_6a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::ByteData(&local_6a8,(string *)&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_780,&local_6a8);
  if ((void *)CONCAT71(local_6a8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_6a8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_6a8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_6a8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  cfd::core::ByteData::ByteData(&local_6a8,(string *)&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_798,&local_6a8);
  if ((void *)CONCAT71(local_6a8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_6a8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_6a8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_6a8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"44h/0h/0h/0/2","");
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"44h/0h/0h/0/2","");
  cfd::core::HDWallet::GeneratePubkeyData((NetType)&local_2c8,(string *)local_780);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)&local_178,(string *)local_798);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Address::Address((Address *)&local_6a8,kTestnet,kVersion0,&local_530);
  if ((void *)CONCAT44(local_530.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_530.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_530.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_530.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  cfd::core::KeyData::GetPubkey();
  cfd::core::Address::Address((Address *)&local_530,kTestnet,kVersion0,(Pubkey *)local_828);
  if (local_828 != (undefined1  [8])0x0) {
    operator_delete((void *)local_828);
  }
  cfd::core::Amount::Amount(local_7a8,100000000);
  cfd::core::TxOut::TxOut((TxOut *)local_318,local_7a8,(Address *)&local_6a8);
  cfd::core::TxOut::TxOut((TxOut *)local_368,local_7a8,(Address *)&local_530);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_3b8,(TxOut *)local_368);
  cfd::core::Psbt::AddTxOut((TxOut *)&local_728);
  cfd::core::Psbt::AddTxOut((TxOutReference *)&local_728);
  local_850.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  local_860.data_._0_4_ = cfd::core::Psbt::GetTxOutCount();
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_828,"2","psbt.GetTxOutCount()",(int *)&local_850,(uint *)&local_860);
  if (local_828[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_850);
    if (local_820.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_820.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_860,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x38c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_860,(Message *)&local_850);
    testing::internal::AssertHelper::~AssertHelper(&local_860);
    if (CONCAT44(local_850.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_850.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_850.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_850.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_850.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_850.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_820,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_860,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000"
             ,(char *)local_828);
  if (local_828 != (undefined1  [8])local_818) {
    operator_delete((void *)local_828);
  }
  if ((void *)CONCAT44(local_850.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_850.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_850.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_850.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_860.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_828);
    if (local_858.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_858.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_850,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x38e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_850,(Message *)local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
    if (local_828 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_828 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_828 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_858,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData();
  cfd::Psbt::Psbt((Psbt *)local_828,&local_850);
  if ((void *)CONCAT44(local_850.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_850.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_850.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_850.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_860,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,(char *)CONCAT44(local_850.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_850.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_));
  if ((pointer *)
      CONCAT44(local_850.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start._4_4_,
               local_850.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start._0_4_) !=
      &local_850.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete((undefined1 *)
                    CONCAT44(local_850.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             local_850.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_860.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_850);
    if (local_858.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_858.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x390,pcVar2);
    testing::internal::AssertHelper::operator=(&local_830,(Message *)&local_850);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    if (CONCAT44(local_850.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_850.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_850.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_850.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_850.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_850.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_858,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_828 = (undefined1  [8])&PTR__Psbt_002e01a0;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(local_7d8);
  cfd::core::Psbt::~Psbt((Psbt *)local_828);
  local_3b8[0] = &PTR__AbstractTxOutReference_002dc150;
  cfd::core::Script::~Script(&local_3a0);
  local_368[0] = cfd::AddressFactory::GetAddress;
  cfd::core::Script::~Script(&local_350);
  local_318[0] = cfd::AddressFactory::GetAddress;
  cfd::core::Script::~Script(&local_300);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_3e8);
  cfd::core::Script::~Script(&local_428);
  local_4b8[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_440);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_4b8);
  if (local_4d0 != (void *)0x0) {
    operator_delete(local_4d0);
  }
  if (local_4e8 != (void *)0x0) {
    operator_delete(local_4e8);
  }
  if (local_500 != (void *)0x0) {
    operator_delete(local_500);
  }
  if (local_530.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != local_510) {
    operator_delete(local_530.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_560);
  cfd::core::Script::~Script(&local_5a0);
  local_630[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_5b8);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_630);
  if (local_648 != (void *)0x0) {
    operator_delete(local_648);
  }
  if (local_660 != (void *)0x0) {
    operator_delete(local_660);
  }
  if (local_678 != (void *)0x0) {
    operator_delete(local_678);
  }
  if (local_6a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != local_688) {
    operator_delete(local_6a8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  cfd::core::KeyData::~KeyData(&local_178);
  cfd::core::KeyData::~KeyData(&local_2c8);
  if (local_768[0] != local_758) {
    operator_delete(local_768[0]);
  }
  if (local_748[0] != local_738) {
    operator_delete(local_748[0]);
  }
  if (local_798[0] != (void *)0x0) {
    operator_delete(local_798[0]);
  }
  if (local_780[0] != (void *)0x0) {
    operator_delete(local_780[0]);
  }
  local_728._0_8_ = &PTR__Psbt_002e01a0;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree((_Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
               *)((long)&local_728 + 0x50));
  cfd::core::Psbt::~Psbt(&local_728.super_Psbt);
  return;
}

Assistant:

TEST(Psbt, SetTxOutOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxOutCount());
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  Amount amount(100000000);
  TxOut txout_1(amount, addr1);
  TxOut txout_2(amount, addr2);
  TxOutReference txout_2r(txout_2);
  psbt.AddTxOut(txout_1);
  psbt.AddTxOut(txout_2r);
  EXPECT_EQ(2, psbt.GetTxOutCount());

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=", psbt2.GetBase64().c_str());
}